

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

void __thiscall Fl_Tree::fix_scrollbar_order(Fl_Tree *this)

{
  int iVar1;
  Fl_Widget **ppFVar2;
  int local_20;
  int local_1c;
  int j;
  int i;
  Fl_Widget **a;
  Fl_Tree *this_local;
  
  ppFVar2 = Fl_Group::array(&this->super_Fl_Group);
  iVar1 = Fl_Group::children(&this->super_Fl_Group);
  if ((Fl_Scrollbar *)ppFVar2[iVar1 + -1] != this->_vscroll) {
    local_20 = 0;
    local_1c = 0;
    while( true ) {
      iVar1 = Fl_Group::children(&this->super_Fl_Group);
      if (iVar1 <= local_20) break;
      if ((Fl_Scrollbar *)ppFVar2[local_20] != this->_vscroll) {
        ppFVar2[local_1c] = ppFVar2[local_20];
        local_1c = local_1c + 1;
      }
      local_20 = local_20 + 1;
    }
    ppFVar2[local_1c] = (Fl_Widget *)this->_vscroll;
  }
  return;
}

Assistant:

void Fl_Tree::fix_scrollbar_order() {
  Fl_Widget** a = (Fl_Widget**)array();
  if (a[children()-1] != _vscroll) {
    int i,j;
#if FLTK_ABI_VERSION >= 10303
    for (i = j = 0; j < children(); j++) {
      if (a[j] != _vscroll && a[j] != _hscroll ) a[i++] = a[j];
    }
    a[i++] = _hscroll;
    a[i++] = _vscroll;
#else
    for (i = j = 0; j < children(); j++) {
      if (a[j] != _vscroll) a[i++] = a[j];
    }
    a[i++] = _vscroll;
#endif
  }
}